

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_affixutils.cpp
# Opt level: O2

UnicodeString *
icu_63::number::impl::AffixUtils::replaceType
          (UnicodeString *__return_storage_ptr__,UnicodeString *affixPattern,AffixPatternType type,
          char16_t replacementChar,UErrorCode *status)

{
  short sVar1;
  undefined1 auVar2 [12];
  bool bVar3;
  int iVar4;
  UErrorCode *status_00;
  AffixTag AVar5;
  AffixTag tag;
  AffixTag local_40;
  
  status_00 = status;
  UnicodeString::UnicodeString(__return_storage_ptr__,affixPattern);
  auVar2 = (undefined1  [12])local_40._4_12_;
  sVar1 = (affixPattern->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar4 = (affixPattern->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)sVar1 >> 5;
  }
  if (iVar4 != 0) {
    local_40._0_8_ = local_40._4_8_ << 0x20;
    local_40.type = auVar2._8_4_;
    local_40.state = STATE_BASE;
    AVar5 = local_40;
    while( true ) {
      bVar3 = hasNext(&local_40,affixPattern);
      if (!bVar3) break;
      tag._8_8_ = affixPattern;
      tag.offset = (int)AVar5._8_8_;
      tag.codePoint = (int)((ulong)AVar5._8_8_ >> 0x20);
      AVar5 = nextToken(AVar5._0_8_,tag,(UnicodeString *)status,status_00);
      if (U_ZERO_ERROR < *status) {
        return __return_storage_ptr__;
      }
      local_40 = AVar5;
      if (AVar5.type == type) {
        UnicodeString::replace(__return_storage_ptr__,AVar5.offset + -1,1,replacementChar);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString AffixUtils::replaceType(const UnicodeString &affixPattern, AffixPatternType type,
                                      char16_t replacementChar, UErrorCode &status) {
    UnicodeString output(affixPattern); // copy
    if (affixPattern.length() == 0) {
        return output;
    };
    AffixTag tag;
    while (hasNext(tag, affixPattern)) {
        tag = nextToken(tag, affixPattern, status);
        if (U_FAILURE(status)) { return output; }
        if (tag.type == type) {
            output.replace(tag.offset - 1, 1, replacementChar);
        }
    }
    return output;
}